

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,
          SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock,char *pageAddress,
          HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  HeapBlockType HVar3;
  uint uVar4;
  uint uVar5;
  uint localObjectSize;
  undefined4 *puVar6;
  char *pcVar7;
  BVStatic<256UL> *heapBlockMarkBits;
  char *pageAddressToScan;
  int i;
  int inUsePageCount;
  char *blockStartAddress;
  BVStatic<256UL> *markBits;
  L2MapChunk *chunk_local;
  uint bucketIndex_local;
  HeapBlockType blockType_local;
  char *pageAddress_local;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_local;
  HeapBlockMap32 *this_local;
  
  if (heapBlock == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  HVar3 = HeapBlock::GetHeapBlockType((HeapBlock *)heapBlock);
  if (HVar3 != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pcVar7 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddress
                     ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  heapBlockMarkBits = GetMarkBitVectorForPages<256ul>(this,pcVar7);
  pcVar7 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetBlockStartAddress(pageAddress);
  if (pcVar7 != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetPageCount
                    ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  uVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetUnusablePageCount
                    ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  pageAddressToScan._0_4_ = 0;
  while( true ) {
    if ((int)(uVar4 - uVar5) <= (int)pageAddressToScan) {
      this->anyHeapBlockRescannedDuringOOM = true;
      return true;
    }
    localObjectSize =
         HeapInfo::GetObjectSizeForBucketIndex<SmallAllocationBlockAttributes>(bucketIndex);
    bVar2 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (heapBlock,pcVar7 + (uint)((int)pageAddressToScan << 0xc),pcVar7,
                       heapBlockMarkBits,localObjectSize,bucketIndex,(bool *)0x0,recycler);
    if (!bVar2) {
      HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
    }
    bVar2 = Recycler::NeedOOMRescan(recycler);
    if (bVar2) break;
    pageAddressToScan._0_4_ = (int)pageAddressToScan + 1;
  }
  return false;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}